

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O3

FilterInfo * __thiscall
helics::FilterFederate::createFilter
          (FilterFederate *this,GlobalBrokerId dest,InterfaceHandle handle,string_view key,
          string_view type_in,string_view type_out,bool cloning)

{
  BaseType BVar1;
  _Head_base<0UL,_helics::FilterInfo_*,_false> this_00;
  GlobalBrokerId core_id_;
  __single_object filt;
  __uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_> local_40;
  GlobalHandle local_38;
  
  BVar1 = (this->mFedID).gid;
  core_id_.gid = dest.gid;
  if ((this->mCoreID).gid == dest.gid) {
    core_id_.gid = BVar1;
  }
  if (dest.gid == 0) {
    core_id_.gid = BVar1;
  }
  this_00._M_head_impl = (FilterInfo *)operator_new(0x120);
  FilterInfo::FilterInfo(this_00._M_head_impl,core_id_,handle,key,type_in,type_out,false);
  local_38.fed_id.gid = ((this_00._M_head_impl)->core_id).gid;
  (this_00._M_head_impl)->cloning = cloning;
  local_40._M_t.
  super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>.
  super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl =
       (tuple<helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>)
       (tuple<helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>)this_00._M_head_impl;
  local_38.handle.hid = handle.hid;
  gmlc::containers::MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle>::insert
            (&this->filters,&local_38,
             (unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_> *)&local_40);
  std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>::~unique_ptr
            ((unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_> *)&local_40);
  return (_Head_base<0UL,_helics::FilterInfo_*,_false>)this_00._M_head_impl;
}

Assistant:

FilterInfo* FilterFederate::createFilter(GlobalBrokerId dest,
                                         InterfaceHandle handle,
                                         std::string_view key,
                                         std::string_view type_in,
                                         std::string_view type_out,
                                         bool cloning)
{
    auto filt = std::make_unique<FilterInfo>((dest == parent_broker_id || dest == mCoreID) ?
                                                 GlobalBrokerId(mFedID) :
                                                 dest,
                                             handle,
                                             key,
                                             type_in,
                                             type_out,
                                             false);

    auto cid = filt->core_id;
    auto* retTarget = filt.get();
    // auto actualKey = key;
    retTarget->cloning = cloning;
    // if (actualKey.empty()) {
    // actualKey = "sFilter_";
    // actualKey.append(std::to_string(handle.baseValue()));
    // }

    // if (filt->core_id == mFedID) {
    filters.insert({cid, handle}, std::move(filt));
    //} else {
    // actualKey.push_back('_');
    //  actualKey.append(std::to_string(cid.baseValue()));
    //    filters.insert({cid, handle}, std::move(filt));
    //}

    return retTarget;
}